

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O0

void init_trip(trip_t *record)

{
  trip_t *record_local;
  
  strcpy(record->route_id,"");
  strcpy(record->service_id,"");
  strcpy(record->id,"");
  strcpy(record->headsign,"");
  strcpy(record->short_name,"");
  record->direction_id = 0;
  strcpy(record->block_id,"");
  strcpy(record->shape_id,"");
  record->wheelchair_accessible = WA_UNKNOWN;
  record->bikes_allowed = BA_UNKNOWN;
  return;
}

Assistant:

void init_trip(trip_t *record) {
    strcpy(record->route_id, "");
    strcpy(record->service_id, "");
    strcpy(record->id, "");
    strcpy(record->headsign, "");
    strcpy(record->short_name, "");
    record->direction_id = 0;
    strcpy(record->block_id, "");
    strcpy(record->shape_id, "");
    record->wheelchair_accessible = WA_UNKNOWN;
    record->bikes_allowed = BA_UNKNOWN;
}